

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O1

void __thiscall
fasttext::AutotuneStrategy::AutotuneStrategy
          (AutotuneStrategy *this,Args *originalArgs,result_type seed)

{
  undefined8 local_24;
  undefined4 local_1c;
  
  Args::Args(&this->bestArgs_);
  this->maxDuration_ = originalArgs->autotuneDuration;
  (this->rng_)._M_x = seed % 0x7fffffff + (ulong)(seed % 0x7fffffff == 0);
  this->trials_ = 0;
  this->bestMinnIndex_ = 0;
  this->bestDsubExponent_ = 1;
  this->bestNonzeroBucket_ = 2000000;
  this->originalBucket_ = originalArgs->bucket;
  (this->minnChoices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (this->minnChoices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  (this->minnChoices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_24 = 0x200000000;
  local_1c = 3;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&this->minnChoices_,&local_24);
  updateBest(this,originalArgs);
  return;
}

Assistant:

AutotuneStrategy::AutotuneStrategy(
    const Args& originalArgs,
    std::minstd_rand::result_type seed)
    : bestArgs_(),
      maxDuration_(originalArgs.autotuneDuration),
      rng_(seed),
      trials_(0),
      bestMinnIndex_(0),
      bestDsubExponent_(1),
      bestNonzeroBucket_(2000000),
      originalBucket_(originalArgs.bucket) {
  minnChoices_ = {0, 2, 3};
  updateBest(originalArgs);
}